

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O0

QDebugIfHasDebugStreamContainer<QMap<QString,_QVariant>,_QString,_QVariant>
operator<<(QDebug *debug,QMap<QString,_QVariant> *map)

{
  long lVar1;
  QMap<QString,_QVariant> *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebug *in_stack_ffffffffffffffb8;
  Stream *which;
  QDebug in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  which = in_RDI;
  QDebug::QDebug((QDebug *)in_RDI,in_stack_ffffffffffffffb8);
  QtPrivate::printAssociativeContainer<QMap<QString,QVariant>>
            ((QDebug *)in_stack_fffffffffffffff0.stream,(char *)which,in_RSI);
  QDebug::~QDebug((QDebug *)&stack0xfffffffffffffff0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebugIfHasDebugStreamContainer<QMap<QString,_QVariant>,_QString,_QVariant>)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebugIfHasDebugStreamContainer<QMap<Key, T>, Key, T> operator<<(QDebug debug, const QMap<Key, T> &map)
{
    return QtPrivate::printAssociativeContainer(std::move(debug), "QMap", map);
}